

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O0

Own<kj::AsyncOutputStream> __thiscall
kj::anon_unknown_30::LowLevelAsyncIoProviderImpl::wrapOutputFd
          (LowLevelAsyncIoProviderImpl *this,int fd,uint flags)

{
  AsyncOutputStream *extraout_RDX;
  undefined4 in_register_00000034;
  Own<kj::AsyncOutputStream> OVar1;
  Own<kj::(anonymous_namespace)::AsyncStreamFd> local_30;
  uint local_20;
  uint local_1c;
  uint flags_local;
  int fd_local;
  LowLevelAsyncIoProviderImpl *this_local;
  
  _flags_local = CONCAT44(in_register_00000034,fd);
  local_1c = flags;
  this_local = this;
  heap<kj::(anonymous_namespace)::AsyncStreamFd,kj::UnixEventPort&,int&,unsigned_int&>
            ((kj *)&local_30,(UnixEventPort *)(_flags_local + 8),(int *)&local_1c,&local_20);
  Own<kj::AsyncOutputStream>::Own<kj::(anonymous_namespace)::AsyncStreamFd,void>
            ((Own<kj::AsyncOutputStream> *)this,&local_30);
  Own<kj::(anonymous_namespace)::AsyncStreamFd>::~Own(&local_30);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

Own<AsyncOutputStream> wrapOutputFd(int fd, uint flags = 0) override {
    return heap<AsyncStreamFd>(eventPort, fd, flags);
  }